

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppMemory.h
# Opt level: O2

void __thiscall cppforth::Forth::memFree(Forth *this)

{
  pointer pVVar1;
  VirtualMemorySegment *pVVar2;
  uint uVar3;
  uint Value;
  ulong uVar4;
  size_type __new_size;
  ulong uVar5;
  VirtualMemorySegment *pVVar6;
  
  requireDStackDepth(this,1,"FREE");
  uVar3 = ForthStack<unsigned_int>::getTop(&this->dStack);
  pVVar1 = (this->VirtualMemory).
           super__Vector_base<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pVVar2 = (this->VirtualMemory).
           super__Vector_base<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar4 = (long)pVVar2 - (long)pVVar1 >> 5;
  Value = 0xffffffc4;
  uVar5 = uVar4;
  do {
    pVVar6 = pVVar2;
    uVar5 = uVar5 - 1;
    if (uVar5 < 3) goto LAB_0011b6fe;
    pVVar2 = pVVar6 + -1;
  } while (pVVar6[-1].start != uVar3);
  if (this->VirtualMemoryFreeSegment == pVVar6[-1].end) {
    this->VirtualMemoryFreeSegment = uVar3;
  }
  __new_size = uVar4 - 1;
  if (uVar5 < __new_size) {
    std::swap<cppforth::Forth::VirtualMemorySegment>(pVVar6 + -1,pVVar1 + __new_size);
    __new_size = ((long)(this->VirtualMemory).
                        super__Vector_base<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->VirtualMemory).
                        super__Vector_base<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) - 1;
  }
  std::
  vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
  ::resize(&this->VirtualMemory,__new_size);
  Value = 0;
LAB_0011b6fe:
  ForthStack<unsigned_int>::setTop(&this->dStack,Value);
  return;
}

Assistant:

void memFree() {
			REQUIRE_DSTACK_DEPTH(1, "FREE");
			auto addr = dStack.getTop();
			for (auto i = VirtualMemory.size() - 1; i > vmSegmentDataSpace; --i){
				if (VirtualMemory[i].start == addr){
					if (VirtualMemoryFreeSegment == VirtualMemory[i].end){
						VirtualMemoryFreeSegment = VirtualMemory[i].start;
					}
					if (i < VirtualMemory.size() - 1){
						std::swap(VirtualMemory[i], VirtualMemory[VirtualMemory.size() - 1]);
					}
					VirtualMemory.resize(VirtualMemory.size() - 1);

					dStack.setTop(0);
					return;
				}
			}
			dStack.setTop(CELL(errorFree));
		}